

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv6Transmitter::ProcessAddAcceptIgnoreEntry
          (RTPUDPv6Transmitter *this,in6_addr ip,uint16_t port)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar1;
  size_t *psVar2;
  uint16_t uVar3;
  RTPMemoryManager *pRVar4;
  HashElement *pHVar5;
  _List_node_base *p_Var6;
  PortInfo *pPVar7;
  HashElement *pHVar8;
  _List_node_base *p_Var9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint8_t local_40;
  uint8_t uStack_3f;
  uint8_t uStack_3e;
  uint8_t uStack_3d;
  uint8_t uStack_3c;
  uint8_t uStack_3b;
  uint8_t uStack_3a;
  uint8_t uStack_39;
  uint8_t uStack_38;
  uint8_t uStack_37;
  uint8_t uStack_36;
  uint8_t uStack_35;
  undefined4 uStack_34;
  
  uStack_34 = ip.__in6_u._12_4_;
  uVar11 = (uStack_34 >> 0x18 | (uStack_34 & 0xff0000) >> 8 | (uStack_34 & 0xff00) << 8 |
           uStack_34 << 0x18) % 0x207d;
  pHVar8 = (this->acceptignoreinfo).table[uVar11];
  (this->acceptignoreinfo).curhashelem = pHVar8;
  bVar12 = false;
  do {
    uStack_38 = ip.__in6_u._8_1_;
    uStack_37 = ip.__in6_u._9_1_;
    uStack_36 = ip.__in6_u._10_1_;
    uStack_35 = ip.__in6_u._11_1_;
    uStack_34._0_1_ = ip.__in6_u._12_1_;
    uStack_34._1_1_ = ip.__in6_u._13_1_;
    uStack_34._2_1_ = ip.__in6_u._14_1_;
    uStack_34._3_1_ = ip.__in6_u._15_1_;
    local_40 = ip.__in6_u._0_1_;
    uStack_3f = ip.__in6_u._1_1_;
    uStack_3e = ip.__in6_u._2_1_;
    uStack_3d = ip.__in6_u._3_1_;
    uStack_3c = ip.__in6_u._4_1_;
    uStack_3b = ip.__in6_u._5_1_;
    uStack_3a = ip.__in6_u._6_1_;
    uStack_39 = ip.__in6_u._7_1_;
    if (pHVar8 == (HashElement *)0x0) break;
    auVar13[0] = -(local_40 == (pHVar8->key).__in6_u.__u6_addr8[0]);
    auVar13[1] = -(uStack_3f == (pHVar8->key).__in6_u.__u6_addr8[1]);
    auVar13[2] = -(uStack_3e == (pHVar8->key).__in6_u.__u6_addr8[2]);
    auVar13[3] = -(uStack_3d == (pHVar8->key).__in6_u.__u6_addr8[3]);
    auVar13[4] = -(uStack_3c == (pHVar8->key).__in6_u.__u6_addr8[4]);
    auVar13[5] = -(uStack_3b == (pHVar8->key).__in6_u.__u6_addr8[5]);
    auVar13[6] = -(uStack_3a == (pHVar8->key).__in6_u.__u6_addr8[6]);
    auVar13[7] = -(uStack_39 == (pHVar8->key).__in6_u.__u6_addr8[7]);
    auVar13[8] = -(uStack_38 == (pHVar8->key).__in6_u.__u6_addr8[8]);
    auVar13[9] = -(uStack_37 == (pHVar8->key).__in6_u.__u6_addr8[9]);
    auVar13[10] = -(uStack_36 == (pHVar8->key).__in6_u.__u6_addr8[10]);
    auVar13[0xb] = -(uStack_35 == (pHVar8->key).__in6_u.__u6_addr8[0xb]);
    auVar13[0xc] = -((uint8_t)uStack_34 == (pHVar8->key).__in6_u.__u6_addr8[0xc]);
    auVar13[0xd] = -(uStack_34._1_1_ == (pHVar8->key).__in6_u.__u6_addr8[0xd]);
    auVar13[0xe] = -(uStack_34._2_1_ == (pHVar8->key).__in6_u.__u6_addr8[0xe]);
    auVar13[0xf] = -(uStack_34._3_1_ == (pHVar8->key).__in6_u.__u6_addr8[0xf]);
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf
                ) == 0xffff) {
      bVar12 = true;
    }
    else {
      pHVar8 = pHVar8->hashnext;
      (this->acceptignoreinfo).curhashelem = pHVar8;
    }
  } while (!bVar12);
  pHVar8 = (this->acceptignoreinfo).curhashelem;
  if (pHVar8 != (HashElement *)0x0) {
    pPVar7 = pHVar8->element;
    if (port == 0) {
      pPVar7->all = true;
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar7->portlist);
      return 0;
    }
    if (pPVar7->all != false) {
      return 0;
    }
    p_Var9 = (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    bVar12 = p_Var9 == (_List_node_base *)&pPVar7->portlist;
    if (bVar12) {
LAB_001267b2:
      p_Var9 = (_List_node_base *)operator_new(0x18);
      *(uint16_t *)&p_Var9[1]._M_next = port;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar2 = &(pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
    }
    else {
      uVar3 = *(uint16_t *)&p_Var9[1]._M_next;
      while (uVar3 != port) {
        p_Var9 = p_Var9->_M_next;
        bVar12 = p_Var9 == (_List_node_base *)&pPVar7->portlist;
        if (bVar12) goto LAB_001267b2;
        uVar3 = *(uint16_t *)&p_Var9[1]._M_next;
      }
    }
    if (bVar12) {
      return 0;
    }
    return 0;
  }
  pRVar4 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    pPVar7 = (PortInfo *)operator_new(0x20);
  }
  else {
    pPVar7 = (PortInfo *)(**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,0x20,0xc);
  }
  plVar1 = &pPVar7->portlist;
  (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  _M_node._M_size = 0;
  pPVar7->all = false;
  if (port == 0) {
    pPVar7->all = true;
  }
  else {
    p_Var9 = (_List_node_base *)operator_new(0x18);
    *(uint16_t *)&p_Var9[1]._M_next = port;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar2 = &(pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
  }
  pHVar8 = (this->acceptignoreinfo).table[uVar11];
  if (pHVar8 != (HashElement *)0x0) {
    bVar12 = false;
    do {
      auVar14[0] = -((pHVar8->key).__in6_u.__u6_addr8[0] == local_40);
      auVar14[1] = -((pHVar8->key).__in6_u.__u6_addr8[1] == uStack_3f);
      auVar14[2] = -((pHVar8->key).__in6_u.__u6_addr8[2] == uStack_3e);
      auVar14[3] = -((pHVar8->key).__in6_u.__u6_addr8[3] == uStack_3d);
      auVar14[4] = -((pHVar8->key).__in6_u.__u6_addr8[4] == uStack_3c);
      auVar14[5] = -((pHVar8->key).__in6_u.__u6_addr8[5] == uStack_3b);
      auVar14[6] = -((pHVar8->key).__in6_u.__u6_addr8[6] == uStack_3a);
      auVar14[7] = -((pHVar8->key).__in6_u.__u6_addr8[7] == uStack_39);
      auVar14[8] = -((pHVar8->key).__in6_u.__u6_addr8[8] == uStack_38);
      auVar14[9] = -((pHVar8->key).__in6_u.__u6_addr8[9] == uStack_37);
      auVar14[10] = -((pHVar8->key).__in6_u.__u6_addr8[10] == uStack_36);
      auVar14[0xb] = -((pHVar8->key).__in6_u.__u6_addr8[0xb] == uStack_35);
      auVar14[0xc] = -((pHVar8->key).__in6_u.__u6_addr8[0xc] == (uint8_t)uStack_34);
      auVar14[0xd] = -((pHVar8->key).__in6_u.__u6_addr8[0xd] == uStack_34._1_1_);
      auVar14[0xe] = -((pHVar8->key).__in6_u.__u6_addr8[0xe] == uStack_34._2_1_);
      auVar14[0xf] = -((pHVar8->key).__in6_u.__u6_addr8[0xf] == uStack_34._3_1_);
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
        bVar12 = true;
      }
      else {
        pHVar8 = pHVar8->hashnext;
      }
    } while ((!bVar12) && (pHVar8 != (HashElement *)0x0));
    if (bVar12) {
      iVar10 = -9;
      bVar12 = true;
      goto LAB_0012685e;
    }
  }
  pRVar4 = (this->acceptignoreinfo).super_RTPMemoryObject.mgr;
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    pHVar8 = (HashElement *)operator_new(0x40);
  }
  else {
    pHVar8 = (HashElement *)
             (**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,0x40,(this->acceptignoreinfo).memorytype);
  }
  *(long *)&(pHVar8->key).__in6_u = ip.__in6_u._0_8_;
  *(long *)((long)&(pHVar8->key).__in6_u + 8) = ip.__in6_u._8_8_;
  pHVar8->element = pPVar7;
  pHVar8->hashprev = (HashElement *)0x0;
  pHVar8->hashnext = (HashElement *)0x0;
  pHVar8->listprev = (HashElement *)0x0;
  pHVar8->listnext = (HashElement *)0x0;
  pHVar8->hashindex = uVar11;
  pHVar5 = (this->acceptignoreinfo).table[uVar11];
  (this->acceptignoreinfo).table[uVar11] = pHVar8;
  pHVar8->hashnext = pHVar5;
  if (pHVar5 != (HashElement *)0x0) {
    pHVar5->hashprev = pHVar8;
  }
  if ((this->acceptignoreinfo).firsthashelem == (HashElement *)0x0) {
    (this->acceptignoreinfo).firsthashelem = pHVar8;
  }
  else {
    pHVar5 = (this->acceptignoreinfo).lasthashelem;
    pHVar5->listnext = pHVar8;
    pHVar8->listprev = pHVar5;
  }
  (this->acceptignoreinfo).lasthashelem = pHVar8;
  bVar12 = false;
  iVar10 = 0;
LAB_0012685e:
  if (bVar12) {
    pRVar4 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    p_Var9 = (plVar1->super__List_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             _M_node.super__List_node_base._M_next;
    if (pRVar4 == (RTPMemoryManager *)0x0) {
      while (p_Var9 != (_List_node_base *)plVar1) {
        p_Var6 = p_Var9->_M_next;
        operator_delete(p_Var9,0x18);
        p_Var9 = p_Var6;
      }
      operator_delete(pPVar7,0x20);
    }
    else {
      while (p_Var9 != (_List_node_base *)plVar1) {
        p_Var6 = p_Var9->_M_next;
        operator_delete(p_Var9,0x18);
        p_Var9 = p_Var6;
      }
      (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pPVar7);
    }
    if (bVar12) {
      return iVar10;
    }
  }
  return 0;
}

Assistant:

int RTPUDPv6Transmitter::ProcessAddAcceptIgnoreEntry(in6_addr ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (acceptignoreinfo.HasCurrentElement()) // An entry for this IP address already exists
	{
		PortInfo *portinf = acceptignoreinfo.GetCurrentElement();
		
		if (port == 0) // select all ports
		{
			portinf->all = true;
			portinf->portlist.clear();
		}
		else if (!portinf->all)
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = portinf->portlist.begin();
			end = portinf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list
					return 0;
			}
			portinf->portlist.push_front(port);
		}
	}
	else // got to create an entry for this IP address
	{
		PortInfo *portinf;
		int status;
		
		portinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_ACCEPTIGNOREPORTINFO) PortInfo();
		if (port == 0) // select all ports
			portinf->all = true;
		else
			portinf->portlist.push_front(port);
		
		status = acceptignoreinfo.AddElement(ip,portinf);
		if (status < 0)
		{
			RTPDelete(portinf,GetMemoryManager());
			return status;
		}
	}
	return 0;
}